

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O0

void __thiscall tcu::Exception::Exception(Exception *this,string *message)

{
  string *message_local;
  Exception *this_local;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)message);
  *(undefined ***)this = &PTR__Exception_03218860;
  std::__cxx11::string::string((string *)&this->m_message,(string *)message);
  return;
}

Assistant:

Exception::Exception (const std::string& message)
	: std::runtime_error(message)
	, m_message			(message)
{
}